

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O1

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type::Enum>
          (TypeChecker *this,Result result,char *desc,Enum args)

{
  pointer pTVar1;
  TypeVector local_48;
  
  if (result.enum_ == Error) {
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar1 = (pointer)operator_new(8);
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1 + 1;
    *pTVar1 = (Type)((ulong)(uint)args | 0xffffffff00000000);
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = pTVar1;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    PrintStackIfFailedV(this,(Result)0x1,desc,&local_48,false);
    operator_delete(pTVar1,8);
  }
  return;
}

Assistant:

inline bool Failed(Result result) {
  return result == Result::Error;
}